

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::labelled_statement::labelled_statement
          (labelled_statement *this,source_extend *extend,wstring *id,statement_ptr *s)

{
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__labelled_statement_001c6960;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  if ((this->id_)._M_string_length == 0) {
    __assert_fail("!id_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x32c,
                  "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
                 );
  }
  if ((this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
    return;
  }
  __assert_fail("s_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x32d,
                "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
               );
}

Assistant:

explicit labelled_statement(const source_extend& extend, const std::wstring& id, statement_ptr&& s) : statement(extend), id_(id), s_(std::move(s)) {
        assert(!id_.empty());
        assert(s_);
    }